

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O0

void __thiscall tst_qpromise_reduce::delayedRejected(tst_qpromise_reduce *this)

{
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<int> args_01;
  bool bVar1;
  int local_1f8 [8];
  iterator local_1d8;
  undefined8 local_1d0;
  QList<int> local_1c8;
  int local_1ac [3];
  iterator local_1a0;
  undefined8 local_198;
  QList<int> local_190;
  QString local_178;
  QString local_160;
  QString local_148;
  QString local_130;
  QString local_118;
  QString local_100;
  bool local_e2;
  bool local_e1 [7];
  bool local_da;
  bool local_d9;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *local_d8;
  QPromise<QList<int>_> local_d0;
  undefined1 local_c0 [8];
  Type p1;
  QPromise<QList<int>_> local_98;
  undefined1 local_88 [8];
  Type p0;
  QVector<int> v1;
  QVector<int> v0;
  undefined1 local_28 [8];
  QVector<int> inputs;
  tst_qpromise_reduce *this_local;
  
  v0.d.size._4_4_ = 4;
  args_01._M_len = 3;
  args_01._M_array = (iterator)((long)&v0.d.size + 4);
  inputs.d.size = (qsizetype)this;
  QList<int>::QList((QList<int> *)local_28,args_01);
  QList<int>::QList((QList<int> *)&v1.d.size);
  QList<int>::QList((QList<int> *)&p0.super_QPromiseBase<int>.m_d);
  QtPromise::resolve<QList<int>&>((QtPromise *)&local_98,(QList<int> *)local_28);
  p1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)&v1.d.size;
  QtPromise::QPromise<QList<int>>::reduce<tst_qpromise_reduce::delayedRejected()::__0,QList<int>>
            ((QPromise<QList<int>> *)local_88,(QVector<int> *)&local_98);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_98);
  QtPromise::resolve<QList<int>&>((QtPromise *)&local_d0,(QList<int> *)local_28);
  local_d8 = &p0.super_QPromiseBase<int>.m_d;
  QtPromise::QPromise<QList<int>>::reduce<tst_qpromise_reduce::delayedRejected()::__1,int>
            ((QPromise<QList<int>> *)local_c0,(QVector<int> *)&local_d0,(int)local_d8);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_d0);
  local_d9 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_88);
  local_da = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_d9,&local_da,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                     ,0xf0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_e1[0] = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_c0);
    local_e2 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_e1,&local_e2,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                       ,0xf1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      QString::QString(&local_118);
      waitForError<int,QString>(&local_100,(QPromise<int> *)local_88,&local_118);
      QString::QString(&local_130,"foo");
      bVar1 = QTest::qCompare(&local_100,&local_130,"waitForError(p0, QString{})","QString{\"foo\"}"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                              ,0xf2);
      QString::~QString(&local_130);
      QString::~QString(&local_100);
      QString::~QString(&local_118);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        QString::QString(&local_160);
        waitForError<int,QString>(&local_148,(QPromise<int> *)local_c0,&local_160);
        QString::QString(&local_178,"bar");
        bVar1 = QTest::qCompare(&local_148,&local_178,"waitForError(p1, QString{})",
                                "QString{\"bar\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                                ,0xf3);
        QString::~QString(&local_178);
        QString::~QString(&local_148);
        QString::~QString(&local_160);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_1ac[0] = 4;
          local_1ac[1] = 6;
          local_1ac[2] = 1;
          local_1a0 = local_1ac;
          local_198 = 3;
          args_00._M_len = 3;
          args_00._M_array = local_1a0;
          QList<int>::QList(&local_190,args_00);
          bVar1 = QTest::qCompare<int>
                            ((QList<int> *)&v1.d.size,&local_190,"v0","(QVector<int>{4, 6, 1})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                             ,0xf4);
          QList<int>::~QList(&local_190);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_1f8[0] = 2;
            local_1f8[1] = 4;
            local_1f8[2] = 0;
            local_1f8[3] = 6;
            local_1f8[4] = 6;
            local_1f8[5] = 1;
            local_1d8 = local_1f8;
            local_1d0 = 6;
            args._M_len = 6;
            args._M_array = local_1d8;
            QList<int>::QList(&local_1c8,args);
            bVar1 = QTest::qCompare<int>
                              ((QList<int> *)&p0.super_QPromiseBase<int>.m_d,&local_1c8,"v1",
                               "(QVector<int>{2, 4, 0, 6, 6, 1})",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_reduce.cpp"
                               ,0xf5);
            QList<int>::~QList(&local_1c8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_e1[1] = false;
              local_e1[2] = false;
              local_e1[3] = false;
              local_e1[4] = false;
            }
            else {
              local_e1[1] = true;
              local_e1[2] = false;
              local_e1[3] = false;
              local_e1[4] = false;
            }
          }
          else {
            local_e1[1] = true;
            local_e1[2] = false;
            local_e1[3] = false;
            local_e1[4] = false;
          }
        }
        else {
          local_e1[1] = true;
          local_e1[2] = false;
          local_e1[3] = false;
          local_e1[4] = false;
        }
      }
      else {
        local_e1[1] = true;
        local_e1[2] = false;
        local_e1[3] = false;
        local_e1[4] = false;
      }
    }
    else {
      local_e1[1] = true;
      local_e1[2] = false;
      local_e1[3] = false;
      local_e1[4] = false;
    }
  }
  else {
    local_e1[1] = true;
    local_e1[2] = false;
    local_e1[3] = false;
    local_e1[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_c0);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_88);
  QList<int>::~QList((QList<int> *)&p0.super_QPromiseBase<int>.m_d);
  QList<int>::~QList((QList<int> *)&v1.d.size);
  QList<int>::~QList((QList<int> *)local_28);
  return;
}

Assistant:

void tst_qpromise_reduce::delayedRejected()
{
    QVector<int> inputs{4, 6, 8};
    QVector<int> v0;
    QVector<int> v1;

    auto p0 = QtPromise::resolve(inputs).reduce([&](int acc, int cur, int idx) {
        v0 << acc << cur << idx;
        if (cur == 6) {
            return QtPromise::QPromise<int>::reject(QString{"foo"});
        }
        return QtPromise::resolve(acc + cur + idx);
    });
    auto p1 = QtPromise::resolve(inputs).reduce(
        [&](int acc, int cur, int idx) {
            v1 << acc << cur << idx;
            if (cur == 6) {
                return QtPromise::QPromise<int>::reject(QString{"bar"});
            }
            return QtPromise::resolve(acc + cur + idx);
        },
        2);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});
    QCOMPARE(waitForError(p1, QString{}), QString{"bar"});
    QCOMPARE(v0, (QVector<int>{4, 6, 1}));
    QCOMPARE(v1, (QVector<int>{2, 4, 0, 6, 6, 1}));
}